

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::DXFImporter::ParseInsertion(DXFImporter *this,LineReader *reader,FileData *output)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  pointer pIVar4;
  InsertBlock local_78;
  
  paVar2 = &local_78.name.field_2;
  local_78.pos.x = 0.0;
  local_78.pos.y = 0.0;
  local_78.pos.z = 0.0;
  local_78.scale.x = 1.0;
  local_78.scale.y = 1.0;
  local_78.scale.z = 1.0;
  local_78.angle = 0.0;
  local_78.name._M_string_length = 0;
  local_78.name.field_2._M_local_buf[0] = '\0';
  local_78.name._M_dataplus._M_p = (pointer)paVar2;
  std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>::
  emplace_back<Assimp::DXF::InsertBlock>
            (&(output->blocks).
              super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].insertions,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.name._M_dataplus._M_p,
                    CONCAT71(local_78.name.field_2._M_allocated_capacity._1_7_,
                             local_78.name.field_2._M_local_buf[0]) + 1);
  }
  if (reader->end < 2) {
    pIVar4 = (output->blocks).
             super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].insertions.
             super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar1 = &reader->value;
    do {
      iVar3 = reader->groupcode;
      if (iVar3 < 0x14) {
        if (iVar3 == 2) {
          std::__cxx11::string::_M_assign((string *)&pIVar4[-1].name);
        }
        else if (iVar3 == 10) {
          local_78.pos._0_8_ = local_78.pos._0_8_ & 0xffffffff00000000;
          fast_atoreal_move<float>((psVar1->_M_dataplus)._M_p,(float *)&local_78,true);
          pIVar4[-1].pos.x = local_78.pos.x;
        }
        else if (iVar3 == 0) {
          return;
        }
      }
      else {
        switch(iVar3) {
        case 0x29:
          local_78.pos._0_8_ = (ulong)(uint)local_78.pos.y << 0x20;
          fast_atoreal_move<float>((psVar1->_M_dataplus)._M_p,(float *)&local_78,true);
          pIVar4[-1].scale.x = local_78.pos.x;
          break;
        case 0x2a:
          local_78.pos._0_8_ = (ulong)(uint)local_78.pos.y << 0x20;
          fast_atoreal_move<float>((psVar1->_M_dataplus)._M_p,(float *)&local_78,true);
          pIVar4[-1].scale.y = local_78.pos.x;
          break;
        case 0x2b:
          local_78.pos._0_8_ = (ulong)(uint)local_78.pos.y << 0x20;
          fast_atoreal_move<float>((psVar1->_M_dataplus)._M_p,(float *)&local_78,true);
          pIVar4[-1].scale.z = local_78.pos.x;
          break;
        case 0x2c:
        case 0x2d:
        case 0x2e:
        case 0x2f:
        case 0x30:
        case 0x31:
          break;
        case 0x32:
          local_78.pos._0_8_ = (ulong)(uint)local_78.pos.y << 0x20;
          fast_atoreal_move<float>((psVar1->_M_dataplus)._M_p,(float *)&local_78,true);
          pIVar4[-1].angle = local_78.pos.x;
          break;
        default:
          if (iVar3 == 0x14) {
            local_78.pos._0_8_ = (ulong)(uint)local_78.pos.y << 0x20;
            fast_atoreal_move<float>((psVar1->_M_dataplus)._M_p,(float *)&local_78,true);
            pIVar4[-1].pos.y = local_78.pos.x;
          }
          else if (iVar3 == 0x1e) {
            local_78.pos._0_8_ = (ulong)(uint)local_78.pos.y << 0x20;
            fast_atoreal_move<float>((psVar1->_M_dataplus)._M_p,(float *)&local_78,true);
            pIVar4[-1].pos.z = local_78.pos.x;
          }
        }
      }
      DXF::LineReader::operator++(reader);
    } while (reader->end < 2);
  }
  return;
}

Assistant:

void DXFImporter::ParseInsertion(DXF::LineReader& reader, DXF::FileData& output) {
    output.blocks.back().insertions.push_back( DXF::InsertBlock() );
    DXF::InsertBlock& bl = output.blocks.back().insertions.back();

    while( !reader.End() && !reader.Is(0)) {
        switch(reader.GroupCode()) {
            // name of referenced block
        case GroupCode_Name:
            bl.name = reader.Value();
            break;

            // translation
        case GroupCode_XComp:
            bl.pos.x = reader.ValueAsFloat();
            break;
        case GroupCode_YComp:
            bl.pos.y = reader.ValueAsFloat();
            break;
        case GroupCode_ZComp:
            bl.pos.z = reader.ValueAsFloat();
            break;

            // scaling
        case 41:
            bl.scale.x = reader.ValueAsFloat();
            break;
        case 42:
            bl.scale.y = reader.ValueAsFloat();
            break;
        case 43:
            bl.scale.z = reader.ValueAsFloat();
            break;

            // rotation angle
        case 50:
            bl.angle = reader.ValueAsFloat();
            break;
        }
        reader++;
    }
}